

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

int * Gia_ManHashFind(Gia_Man_t *p,int iLit0,int iLit1,int iLitC)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *__assertion;
  uint *puVar8;
  Gia_Obj_t *pObj;
  
  piVar1 = p->pHTable;
  uVar7 = p->nHTable;
  iVar2 = Abc_Lit2Var(iLit0);
  iVar3 = Abc_Lit2Var(iLit1);
  iVar4 = Abc_LitIsCompl(iLit0);
  iVar5 = Abc_LitIsCompl(iLit1);
  if ((iLit0 < iLit1) || (p->pMuxes != (uint *)0x0)) {
    if ((iLit0 < iLit1) ||
       ((iVar6 = Abc_LitIsCompl(iLit0), iVar6 == 0 && (iVar6 = Abc_LitIsCompl(iLit1), iVar6 == 0))))
    {
      if ((iLitC == -1) || (iVar6 = Abc_LitIsCompl(iLit1), iVar6 == 0)) {
        puVar8 = (uint *)(piVar1 + (int)((uint)(iVar5 * 0x161 +
                                               iVar4 * 0x38f + iVar3 * 0xb9b +
                                               iVar2 * 0x1f01 + iLitC * 0x7db) % uVar7));
        uVar7 = *puVar8;
        if (uVar7 != 0) goto LAB_0057a01d;
        pObj = (Gia_Obj_t *)0x0;
        while ((pObj != (Gia_Obj_t *)0x0 &&
               (((iVar2 = Gia_ObjFaninLit0p(p,pObj), iVar2 != iLit0 ||
                 (iVar2 = Gia_ObjFaninLit1p(p,pObj), iVar2 != iLit1)) ||
                ((p->pMuxes != (uint *)0x0 && (iVar2 = Gia_ObjFaninLit2p(p,pObj), iVar2 != iLitC))))
               ))) {
          uVar7 = pObj->Value;
          puVar8 = &pObj->Value;
          pObj = (Gia_Obj_t *)0x0;
          if (uVar7 != 0) {
LAB_0057a01d:
            iVar2 = Abc_Lit2Var(uVar7);
            pObj = Gia_ManObj(p,iVar2);
          }
        }
        return (int *)puVar8;
      }
      __assertion = "iLitC == -1 || !Abc_LitIsCompl(iLit1)";
      uVar7 = 0x3c;
    }
    else {
      __assertion = "iLit0 < iLit1 || (!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1))";
      uVar7 = 0x3b;
    }
  }
  else {
    __assertion = "p->pMuxes || iLit0 < iLit1";
    uVar7 = 0x3a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                ,uVar7,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
}

Assistant:

static inline int * Gia_ManHashFind( Gia_Man_t * p, int iLit0, int iLit1, int iLitC )
{
    Gia_Obj_t * pThis;
    int * pPlace = p->pHTable + Gia_ManHashOne( iLit0, iLit1, iLitC, p->nHTable );
    assert( p->pMuxes || iLit0 < iLit1 );
    assert( iLit0 < iLit1 || (!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1)) );
    assert( iLitC == -1 || !Abc_LitIsCompl(iLit1) );
    for ( pThis = (*pPlace)? Gia_ManObj(p, Abc_Lit2Var(*pPlace)) : NULL; pThis; 
          pPlace = (int *)&pThis->Value, pThis = (*pPlace)? Gia_ManObj(p, Abc_Lit2Var(*pPlace)) : NULL )
              if ( Gia_ObjFaninLit0p(p, pThis) == iLit0 && Gia_ObjFaninLit1p(p, pThis) == iLit1 && (p->pMuxes == NULL || Gia_ObjFaninLit2p(p, pThis) == iLitC) )
                  break;
    return pPlace;
}